

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_interfaces.c
# Opt level: O3

void nhdp_interfaces_cleanup(void)

{
  list_entity *plVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  
  plVar2 = _interface_tree.list_head.prev;
  plVar3 = _interface_tree.list_head.next;
  if ((_interface_tree.list_head.next)->prev != _interface_tree.list_head.prev) {
    do {
      plVar1 = plVar3->next;
      if (*(char *)&plVar3[0xe].prev == '\x01') {
        nhdp_interface_remove((nhdp_interface *)&plVar3[-0x16].prev);
        plVar2 = _interface_tree.list_head.prev;
      }
      plVar3 = plVar1;
    } while (plVar1->prev != plVar2);
  }
  oonf_timer_remove(&_interface_hello_timer);
  oonf_timer_remove(&_removed_address_hold_timer);
  oonf_class_remove(&_interface_info);
  oonf_class_remove(&_addr_info);
  return;
}

Assistant:

void
nhdp_interfaces_cleanup(void) {
  struct nhdp_interface *interf, *if_it;

  avl_for_each_element_safe(&_interface_tree, interf, _node, if_it) {
    if (interf->registered) {
      nhdp_interface_remove(interf);
    }
  }

  oonf_timer_remove(&_interface_hello_timer);
  oonf_timer_remove(&_removed_address_hold_timer);
  oonf_class_remove(&_interface_info);
  oonf_class_remove(&_addr_info);
}